

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t __size;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  uint uVar65;
  int iVar66;
  int *piVar67;
  size_t sVar68;
  long *plVar69;
  size_t sVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  pointer piVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  Layer *pLVar90;
  long lVar91;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar92;
  int iVar93;
  void *pvVar94;
  int iVar95;
  int iVar96;
  ulong uVar97;
  size_t totalsize;
  ulong uVar98;
  long lVar99;
  ulong uVar100;
  uint uVar101;
  size_type __n;
  ulong uVar102;
  int iVar103;
  ulong uVar104;
  uint uVar105;
  void *pvVar106;
  float *pfVar107;
  bool bVar108;
  bool bVar109;
  float fVar110;
  long local_be8;
  void *local_be0;
  void *ptr;
  undefined8 uStack_bb0;
  undefined4 uStack_ba8;
  undefined4 uStack_ba4;
  int local_ba0;
  undefined4 uStack_b9c;
  Allocator *local_b98;
  undefined1 auStack_b90 [16];
  ulong uStack_b80;
  float *local_b70;
  ulong local_b68;
  ulong local_b60;
  long local_b58;
  void *local_b50;
  void *local_b48;
  ulong local_b40;
  Mat bottom_blob_int8;
  void *local_af8;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  size_t sStack_ae8;
  int iStack_ae0;
  Allocator *local_ad8;
  undefined1 local_ad0 [16];
  size_t local_ac0;
  void *local_ab8;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  size_t sStack_aa8;
  int iStack_aa0;
  Allocator *local_a98;
  undefined1 local_a90 [16];
  size_t local_a80;
  void *local_a78;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined8 uStack_a68;
  bool bStack_a60;
  bool bStack_a5f;
  bool bStack_a5e;
  bool bStack_a5d;
  Allocator *local_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  ulong local_a30;
  long local_a28;
  int local_a1c;
  void *ptr_1;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  Allocator *pAStack_a08;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  Allocator *local_9f8;
  undefined1 local_9f0 [16];
  ulong local_9e0;
  Mat top_blob_g;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g_1;
  ParamDict pd;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined7 uVar17;
  undefined7 uVar18;
  undefined7 uVar19;
  undefined7 uVar20;
  undefined6 uVar25;
  undefined6 uVar26;
  undefined6 uVar27;
  undefined6 uVar28;
  undefined5 uVar33;
  undefined5 uVar34;
  undefined5 uVar35;
  undefined5 uVar36;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined3 uVar49;
  undefined3 uVar50;
  undefined3 uVar51;
  undefined3 uVar52;
  undefined2 uVar57;
  undefined2 uVar58;
  undefined2 uVar59;
  undefined2 uVar60;
  undefined1 uVar78;
  undefined1 uVar79;
  undefined3 uVar80;
  undefined1 uVar81;
  undefined2 uVar82;
  undefined1 uVar83;
  
  if (((bottom_blob->dims == 1) && (this->kernel_w == 1)) && (this->kernel_h == 1)) {
    iVar87 = this->weight_data_size / this->num_output;
    iVar96 = bottom_blob->w;
    if (iVar96 == iVar87) {
      pLVar90 = create_layer(0xf);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->num_output);
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,this->weight_data_size);
      ParamDict::set(&pd,8,this->int8_scale_term);
      (*pLVar90->_vptr_Layer[2])(pLVar90,&pd);
      lVar91 = 0;
      do {
        *(undefined1 (*) [16])((long)&bottom_blob_int8.refcount + lVar91 + 4) =
             (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&bottom_blob_int8.data + lVar91) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&bottom_blob_int8.allocator + lVar91) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&bottom_blob_int8.h + lVar91) = (undefined1  [16])0x0;
        lVar91 = lVar91 + 0x40;
      } while (lVar91 != 0x100);
      if (&bottom_blob_int8 != &this->weight_data) {
        piVar67 = (this->weight_data).refcount;
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + 1;
          UNLOCK();
        }
        piVar67 = (int *)CONCAT44(bottom_blob_int8.refcount._4_4_,bottom_blob_int8.refcount._0_4_);
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + -1;
          UNLOCK();
          if (*piVar67 == 0) {
            if (bottom_blob_int8.allocator == (Allocator *)0x0) {
              if (bottom_blob_int8.data != (void *)0x0) {
                free(bottom_blob_int8.data);
              }
            }
            else {
              (*(bottom_blob_int8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob_int8.data = (this->weight_data).data;
        piVar67 = (this->weight_data).refcount;
        bottom_blob_int8.refcount._0_4_ = SUB84(piVar67,0);
        bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)piVar67 >> 0x20);
        sVar68 = (this->weight_data).elemsize;
        bottom_blob_int8.elemsize._0_4_ = (undefined4)sVar68;
        bottom_blob_int8.elemsize._4_4_ = (undefined4)(sVar68 >> 0x20);
        bottom_blob_int8.elempack = (this->weight_data).elempack;
        bottom_blob_int8.allocator = (this->weight_data).allocator;
        uVar72 = (this->weight_data).dims;
        uVar73 = (this->weight_data).w;
        uVar74 = (this->weight_data).h;
        uVar75 = (this->weight_data).c;
        bottom_blob_int8.cstep = (this->weight_data).cstep;
        bottom_blob_int8.dims = uVar72;
        bottom_blob_int8.w = uVar73;
        bottom_blob_int8.h = uVar74;
        bottom_blob_int8.c = uVar75;
      }
      if ((Mat *)&local_af8 != &this->bias_data) {
        piVar67 = (this->bias_data).refcount;
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + 1;
          UNLOCK();
        }
        piVar67 = (int *)CONCAT44(uStack_aec,uStack_af0);
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + -1;
          UNLOCK();
          if (*piVar67 == 0) {
            if (local_ad8 == (Allocator *)0x0) {
              if (local_af8 != (void *)0x0) {
                free(local_af8);
              }
            }
            else {
              (*local_ad8->_vptr_Allocator[3])();
            }
          }
        }
        local_af8 = (this->bias_data).data;
        piVar67 = (this->bias_data).refcount;
        uStack_af0 = SUB84(piVar67,0);
        uStack_aec = (undefined4)((ulong)piVar67 >> 0x20);
        sStack_ae8 = (this->bias_data).elemsize;
        iStack_ae0 = (this->bias_data).elempack;
        local_ad8 = (this->bias_data).allocator;
        local_ad0._0_4_ = (this->bias_data).dims;
        local_ad0._4_4_ = (this->bias_data).w;
        local_ad0._8_4_ = (this->bias_data).h;
        local_ad0._12_4_ = (this->bias_data).c;
        local_ac0 = (this->bias_data).cstep;
      }
      if (this->int8_scale_term != 0) {
        if ((Mat *)&local_ab8 != &this->weight_data_int8_scales) {
          piVar67 = (this->weight_data_int8_scales).refcount;
          if (piVar67 != (int *)0x0) {
            LOCK();
            *piVar67 = *piVar67 + 1;
            UNLOCK();
          }
          piVar67 = (int *)CONCAT44(uStack_aac,uStack_ab0);
          if (piVar67 != (int *)0x0) {
            LOCK();
            *piVar67 = *piVar67 + -1;
            UNLOCK();
            if (*piVar67 == 0) {
              if (local_a98 == (Allocator *)0x0) {
                if (local_ab8 != (void *)0x0) {
                  free(local_ab8);
                }
              }
              else {
                (*local_a98->_vptr_Allocator[3])();
              }
            }
          }
          local_ab8 = (this->weight_data_int8_scales).data;
          piVar67 = (this->weight_data_int8_scales).refcount;
          uStack_ab0 = SUB84(piVar67,0);
          uStack_aac = (undefined4)((ulong)piVar67 >> 0x20);
          sStack_aa8 = (this->weight_data_int8_scales).elemsize;
          iStack_aa0 = (this->weight_data_int8_scales).elempack;
          local_a98 = (this->weight_data_int8_scales).allocator;
          local_a90._0_4_ = (this->weight_data_int8_scales).dims;
          local_a90._4_4_ = (this->weight_data_int8_scales).w;
          local_a90._8_4_ = (this->weight_data_int8_scales).h;
          local_a90._12_4_ = (this->weight_data_int8_scales).c;
          local_a80 = (this->weight_data_int8_scales).cstep;
        }
        ptr = &this->bottom_blob_int8_scale;
        uStack_bb0._0_4_ = 0;
        uStack_bb0._4_4_ = 0;
        uStack_ba8 = 4;
        uStack_ba4 = 0;
        local_ba0._0_1_ = true;
        local_ba0._1_1_ = false;
        local_ba0._2_1_ = false;
        local_ba0._3_1_ = false;
        local_b98 = (Allocator *)0x0;
        auStack_b90._0_8_ = 0x100000002;
        auStack_b90._8_8_ = 0x100000004;
        uStack_b80 = 4;
        piVar67 = (int *)CONCAT44(uStack_a6c,uStack_a70);
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + -1;
          UNLOCK();
          if (*piVar67 == 0) {
            if (local_a58 == (Allocator *)0x0) {
              if (local_a78 != (void *)0x0) {
                free(local_a78);
              }
            }
            else {
              (*local_a58->_vptr_Allocator[3])();
            }
          }
        }
        piVar67 = (int *)CONCAT44(uStack_bb0._4_4_,(undefined4)uStack_bb0);
        local_a78 = ptr;
        uStack_a70 = (undefined4)uStack_bb0;
        uStack_a6c = uStack_bb0._4_4_;
        uStack_a68 = CONCAT44(uStack_ba4,uStack_ba8);
        bStack_a60 = (bool)(undefined1)local_ba0;
        bStack_a5f = (bool)local_ba0._1_1_;
        bStack_a5e = (bool)local_ba0._2_1_;
        bStack_a5d = (bool)local_ba0._3_1_;
        local_a58 = local_b98;
        local_a50 = auStack_b90._0_8_;
        uStack_a48 = auStack_b90._8_8_;
        local_a40 = uStack_b80;
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + -1;
          UNLOCK();
          if (*piVar67 == 0) {
            if (local_b98 == (Allocator *)0x0) {
              if (ptr != (void *)0x0) {
                free(ptr);
              }
            }
            else {
              (*local_b98->_vptr_Allocator[3])();
            }
          }
        }
        uStack_ba8 = 0;
        uStack_ba4 = 0;
        local_ba0._0_1_ = false;
        local_ba0._1_1_ = false;
        local_ba0._2_1_ = false;
        local_ba0._3_1_ = false;
        ptr = (void *)0x0;
        uStack_bb0._0_4_ = 0;
        uStack_bb0._4_4_ = 0;
        auStack_b90 = (undefined1  [16])0x0;
        uStack_b80 = 0;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&ptr,&bottom_blob_int8);
      (*pLVar90->_vptr_Layer[3])(pLVar90,&ptr);
      ModelBin::~ModelBin((ModelBin *)&ptr);
      (*pLVar90->_vptr_Layer[4])(pLVar90,opt);
      (*pLVar90->_vptr_Layer[7])(pLVar90,bottom_blob,top_blob,opt);
      (*pLVar90->_vptr_Layer[1])(pLVar90);
      lVar91 = 0xc0;
      do {
        piVar67 = *(int **)((long)&bottom_blob_int8.refcount + lVar91);
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + -1;
          UNLOCK();
          if (*piVar67 == 0) {
            pvVar92 = *(void **)((long)&bottom_blob_int8.data + lVar91);
            plVar69 = *(long **)((long)&bottom_blob_int8.allocator + lVar91);
            if (plVar69 == (long *)0x0) {
              if (pvVar92 != (void *)0x0) {
                free(pvVar92);
              }
            }
            else {
              (**(code **)(*plVar69 + 0x18))();
            }
          }
        }
        *(undefined1 (*) [16])((long)&bottom_blob_int8.refcount + lVar91 + 4) =
             (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&bottom_blob_int8.data + lVar91) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&bottom_blob_int8.dims + lVar91) = (undefined1  [16])0x0;
        *(undefined8 *)((long)&bottom_blob_int8.cstep + lVar91) = 0;
        lVar91 = lVar91 + -0x40;
      } while (lVar91 != -0x40);
      lVar91 = 0x8c0;
      do {
        piVar67 = *(int **)((long)&pd.params[0].v.data + lVar91);
        if (piVar67 != (int *)0x0) {
          LOCK();
          *piVar67 = *piVar67 + -1;
          UNLOCK();
          if (*piVar67 == 0) {
            pvVar92 = *(void **)((long)&pd.params[0].type + lVar91);
            plVar69 = *(long **)((long)&pd.params[0].v.elempack + lVar91);
            if (plVar69 == (long *)0x0) {
              if (pvVar92 != (void *)0x0) {
                free(pvVar92);
              }
            }
            else {
              (**(code **)(*plVar69 + 0x18))();
            }
          }
        }
        *(undefined1 (*) [16])((long)&pd.params[0].v.data + lVar91 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd.params[0].type + lVar91) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd.params[0].v.allocator + lVar91) = (undefined1  [16])0x0;
        *(undefined8 *)((long)&pd.params[0].v.h + lVar91) = 0;
        lVar91 = lVar91 + -0x48;
      } while (lVar91 != -0x40);
      if (iVar96 == iVar87) {
        return 0;
      }
    }
  }
  iVar96 = bottom_blob->w;
  iVar87 = bottom_blob->h;
  uVar65 = bottom_blob->c;
  uVar71 = bottom_blob->h;
  uVar97 = (ulong)uVar65;
  piVar67 = (int *)bottom_blob->elemsize;
  uVar105 = (this->kernel_w + -1) * this->dilation_w;
  uVar101 = (this->kernel_h + -1) * this->dilation_h;
  pd.params[0]._0_8_ = bottom_blob->data;
  pd.params[0].v.data = bottom_blob->refcount;
  pd.params[0].v.elemsize._0_4_ = bottom_blob->elempack;
  pd.params[0].v._24_8_ = bottom_blob->allocator;
  pd.params[0].v.allocator._0_4_ = bottom_blob->dims;
  pd.params[0].v.allocator._4_4_ = bottom_blob->w;
  pd.params[0].v.dims = bottom_blob->h;
  pd.params[0].v.w = bottom_blob->c;
  pd.params[0].v._48_8_ = bottom_blob->cstep;
  if ((int *)pd.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)pd.params[0].v.data = *pd.params[0].v.data + 1;
    UNLOCK();
  }
  iVar88 = 0;
  pd.params[0].v.refcount = piVar67;
  if ((piVar67 != (int *)0x1 & this->use_int8_inference) == 1) {
    bottom_blob_int8.allocator = opt->workspace_allocator;
    auVar85._4_4_ = -(uint)(uVar71 == 0);
    auVar85._0_4_ = -(uint)(iVar96 == 0);
    auVar85._8_4_ = -(uint)(uVar65 == 0);
    auVar85._12_4_ = 0;
    movmskps((int)&bottom_blob_int8.dims,auVar85 << 0x20);
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.elemsize._0_4_ = 1;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.elempack = 1;
    bottom_blob_int8.dims = 3;
    bottom_blob_int8.cstep = (long)(iVar87 * iVar96) + 0xfU & 0xfffffffffffffff0;
    uVar98 = bottom_blob_int8.cstep * (long)(int)uVar65;
    bottom_blob_int8.w = iVar96;
    bottom_blob_int8.h = iVar87;
    bottom_blob_int8.c = uVar65;
    if (uVar98 != 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        ptr = (void *)0x0;
        iVar88 = posix_memalign(&ptr,0x10,uVar98 | 4);
        bottom_blob_int8.data = ptr;
        if (iVar88 != 0) {
          ptr = (void *)0x0;
          bottom_blob_int8.data = ptr;
        }
      }
      else {
        iVar88 = (*(bottom_blob_int8.allocator)->_vptr_Allocator[2])
                           (bottom_blob_int8.allocator,uVar98 | 4);
        bottom_blob_int8.data = (void *)CONCAT44(extraout_var,iVar88);
      }
      bottom_blob_int8.refcount = (int *)((long)bottom_blob_int8.data + uVar98);
      *(undefined4 *)((long)bottom_blob_int8.data + uVar98) = 1;
    }
    bVar108 = bottom_blob_int8.data != (void *)0x0;
    bVar109 = (long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0;
    iVar88 = -100;
    if (bVar108 && bVar109) {
      ptr = *(void **)opt;
      uVar1 = opt->workspace_allocator;
      uVar5 = opt->use_winograd_convolution;
      uVar13 = opt->use_sgemm_convolution;
      uVar21 = opt->use_int8_inference;
      uVar29 = opt->use_vulkan_compute;
      uVar37 = opt->use_fp16_packed;
      uVar45 = opt->use_fp16_storage;
      uVar53 = opt->use_fp16_arithmetic;
      uVar61 = opt->use_int8_storage;
      uVar57 = CONCAT11(uVar61,uVar53);
      uVar49 = CONCAT21(uVar57,uVar45);
      uVar41 = CONCAT31(uVar49,uVar37);
      uVar33 = CONCAT41(uVar41,uVar29);
      uVar25 = CONCAT51(uVar33,uVar21);
      uVar17 = CONCAT61(uVar25,uVar13);
      uVar9 = CONCAT71(uVar17,uVar5);
      local_b98 = *(Allocator **)&opt->use_int8_arithmetic;
      uStack_ba8 = (undefined4)uVar1;
      uStack_ba4 = (undefined4)((ulong)uVar1 >> 0x20);
      local_ba0 = (int)uVar9;
      uStack_bb0._0_4_ = SUB84(bottom_blob_int8.allocator,0);
      uStack_bb0._4_4_ = (undefined4)((ulong)bottom_blob_int8.allocator >> 0x20);
      uStack_b9c = uVar41;
      (*this->quantize->_vptr_Layer[7])(this->quantize,bottom_blob);
      if (bottom_blob_int8.refcount != (int *)0x0) {
        LOCK();
        *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + 1;
        UNLOCK();
      }
      if (pd.params[0].v.data != (void *)0x0) {
        LOCK();
        *(int *)pd.params[0].v.data = *pd.params[0].v.data + -1;
        UNLOCK();
        if (*pd.params[0].v.data == 0) {
          if (pd.params[0].v._24_8_ == 0) {
            if (pd.params[0]._0_8_ != 0) {
              free((void *)pd.params[0]._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)pd.params[0].v._24_8_ + 0x18))();
          }
        }
      }
      pd.params[0]._0_8_ = bottom_blob_int8.data;
      pd.params[0].v.refcount =
           (int *)CONCAT44(bottom_blob_int8.elemsize._4_4_,(undefined4)bottom_blob_int8.elemsize);
      pd.params[0].v.elemsize._0_4_ = bottom_blob_int8.elempack;
      pd.params[0].v._24_8_ = bottom_blob_int8.allocator;
      pd.params[0].v.allocator._4_4_ = bottom_blob_int8.w;
      pd.params[0].v.allocator._0_4_ = bottom_blob_int8.dims;
      pd.params[0].v.w = bottom_blob_int8.c;
      pd.params[0].v.dims = bottom_blob_int8.h;
      pd.params[0].v.h = (undefined4)bottom_blob_int8.cstep;
      pd.params[0].v.c = bottom_blob_int8.cstep._4_4_;
      iVar88 = 0;
      pd.params[0].v.data = bottom_blob_int8.refcount;
    }
    if (bottom_blob_int8.refcount != (int *)0x0) {
      LOCK();
      *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
      UNLOCK();
      if (*bottom_blob_int8.refcount == 0) {
        if (bottom_blob_int8.allocator == (Allocator *)0x0) {
          if (bottom_blob_int8.data != (void *)0x0) {
            free(bottom_blob_int8.data);
          }
        }
        else {
          (*(bottom_blob_int8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar103 = iVar88;
    if (!bVar108 || !bVar109) goto LAB_001281e8;
  }
  bottom_blob_int8.data = (void *)pd.params[0]._0_8_;
  bottom_blob_int8.elemsize._0_4_ = SUB84(pd.params[0].v.refcount,0);
  bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)pd.params[0].v.refcount >> 0x20);
  bottom_blob_int8.elempack = (int)pd.params[0].v.elemsize;
  bottom_blob_int8.allocator = (Allocator *)pd.params[0].v._24_8_;
  bottom_blob_int8.dims = (int)pd.params[0].v.allocator;
  bottom_blob_int8.w = pd.params[0].v.allocator._4_4_;
  bottom_blob_int8.h = pd.params[0].v.dims;
  bottom_blob_int8.c = pd.params[0].v.w;
  bottom_blob_int8.cstep._0_4_ = pd.params[0].v.h;
  bottom_blob_int8.cstep._4_4_ = pd.params[0].v.c;
  if ((int *)pd.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)pd.params[0].v.data = *pd.params[0].v.data + 1;
    UNLOCK();
  }
  iVar103 = this->pad_left;
  bottom_blob_int8.refcount = (int *)pd.params[0].v.data;
  if (((iVar103 < 1) && (iVar66 = this->pad_right, iVar66 < 1)) &&
     ((iVar89 = this->pad_top, iVar89 < 1 && (iVar93 = this->pad_bottom, iVar93 < 1)))) {
    if (iVar93 == -0xe9 && (iVar89 == -0xe9 && (iVar66 == -0xe9 && iVar103 == -0xe9))) {
      iVar103 = uVar105 - (iVar96 + -1) % this->stride_w;
      iVar96 = uVar101 - (iVar87 + -1) % this->stride_h;
      if ((0 < iVar103) || (0 < iVar96)) {
        local_b98 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        uVar3 = opt->workspace_allocator;
        uVar7 = opt->use_winograd_convolution;
        uVar15 = opt->use_sgemm_convolution;
        uVar23 = opt->use_int8_inference;
        uVar31 = opt->use_vulkan_compute;
        uVar39 = opt->use_fp16_packed;
        uVar47 = opt->use_fp16_storage;
        uVar55 = opt->use_fp16_arithmetic;
        uVar63 = opt->use_int8_storage;
        uVar59 = CONCAT11(uVar63,uVar55);
        uVar51 = CONCAT21(uVar59,uVar47);
        uVar43 = CONCAT31(uVar51,uVar39);
        uVar35 = CONCAT41(uVar43,uVar31);
        uVar27 = CONCAT51(uVar35,uVar23);
        uVar19 = CONCAT61(uVar27,uVar15);
        uVar11 = CONCAT71(uVar19,uVar7);
        uStack_ba8 = (undefined4)uVar3;
        uStack_ba4 = (undefined4)((ulong)uVar3 >> 0x20);
        local_ba0 = (int)uVar11;
        uStack_bb0._0_4_ = SUB84(opt->workspace_allocator,0);
        uStack_bb0._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        uStack_b9c = uVar43;
        copy_make_border((Mat *)&pd,&bottom_blob_int8,iVar96 / 2,iVar96 - iVar96 / 2,iVar103 / 2,
                         iVar103 - iVar103 / 2,0,this->pad_value,(Option *)&ptr);
      }
    }
    else if (iVar93 == -0xea && (iVar89 == -0xea && (iVar66 == -0xea && iVar103 == -0xea))) {
      iVar103 = uVar105 - (iVar96 + -1) % this->stride_w;
      iVar96 = uVar101 - (iVar87 + -1) % this->stride_h;
      if ((0 < iVar103) || (0 < iVar96)) {
        local_b98 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        uVar4 = opt->workspace_allocator;
        uVar8 = opt->use_winograd_convolution;
        uVar16 = opt->use_sgemm_convolution;
        uVar24 = opt->use_int8_inference;
        uVar32 = opt->use_vulkan_compute;
        uVar40 = opt->use_fp16_packed;
        uVar48 = opt->use_fp16_storage;
        uVar56 = opt->use_fp16_arithmetic;
        uVar64 = opt->use_int8_storage;
        uVar60 = CONCAT11(uVar64,uVar56);
        uVar52 = CONCAT21(uVar60,uVar48);
        uVar44 = CONCAT31(uVar52,uVar40);
        uVar36 = CONCAT41(uVar44,uVar32);
        uVar28 = CONCAT51(uVar36,uVar24);
        uVar20 = CONCAT61(uVar28,uVar16);
        uVar12 = CONCAT71(uVar20,uVar8);
        uStack_ba8 = (undefined4)uVar4;
        uStack_ba4 = (undefined4)((ulong)uVar4 >> 0x20);
        local_ba0 = (int)uVar12;
        uStack_bb0._0_4_ = SUB84(opt->workspace_allocator,0);
        uStack_bb0._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        uStack_b9c = uVar44;
        copy_make_border((Mat *)&pd,&bottom_blob_int8,iVar96 - iVar96 / 2,iVar96 / 2,
                         iVar103 - iVar103 / 2,iVar103 / 2,0,this->pad_value,(Option *)&ptr);
      }
    }
  }
  else {
    local_b98 = *(Allocator **)&opt->use_int8_arithmetic;
    ptr = *(void **)opt;
    uVar2 = opt->workspace_allocator;
    uVar6 = opt->use_winograd_convolution;
    uVar14 = opt->use_sgemm_convolution;
    uVar22 = opt->use_int8_inference;
    uVar30 = opt->use_vulkan_compute;
    uVar38 = opt->use_fp16_packed;
    uVar46 = opt->use_fp16_storage;
    uVar54 = opt->use_fp16_arithmetic;
    uVar62 = opt->use_int8_storage;
    uVar58 = CONCAT11(uVar62,uVar54);
    uVar50 = CONCAT21(uVar58,uVar46);
    uVar42 = CONCAT31(uVar50,uVar38);
    uVar34 = CONCAT41(uVar42,uVar30);
    uVar26 = CONCAT51(uVar34,uVar22);
    uVar18 = CONCAT61(uVar26,uVar14);
    uVar10 = CONCAT71(uVar18,uVar6);
    uStack_ba8 = (undefined4)uVar2;
    uStack_ba4 = (undefined4)((ulong)uVar2 >> 0x20);
    local_ba0 = (int)uVar10;
    uStack_bb0._0_4_ = SUB84(opt->workspace_allocator,0);
    uStack_bb0._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    uStack_b9c = uVar42;
    copy_make_border((Mat *)&pd,&bottom_blob_int8,this->pad_top,this->pad_bottom,iVar103,
                     this->pad_right,0,this->pad_value,(Option *)&ptr);
  }
  iVar96 = bottom_blob_int8.w;
  iVar103 = -100;
  if ((bottom_blob_int8.data != (void *)0x0) &&
     ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
    local_b40 = (long)(int)(~uVar105 + bottom_blob_int8.w) / (long)this->stride_w & 0xffffffff;
    local_b68 = (long)(int)(~uVar101 + bottom_blob_int8.h) / (long)this->stride_h & 0xffffffff;
    uVar101 = this->kernel_w * this->kernel_h;
    __n = (size_type)(int)uVar101;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&ptr);
    piVar86 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < this->kernel_h) {
      iVar87 = this->dilation_h;
      iVar103 = this->dilation_w;
      iVar66 = this->kernel_w;
      iVar89 = 0;
      iVar93 = 0;
      iVar95 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar91 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar89 + lVar91] = iVar93;
            iVar93 = iVar93 + this->dilation_w;
            lVar91 = lVar91 + 1;
          } while ((int)lVar91 < this->kernel_w);
          iVar89 = iVar89 + (int)lVar91;
        }
        iVar93 = iVar93 + (iVar96 * iVar87 - iVar103 * iVar66);
        iVar95 = iVar95 + 1;
      } while (iVar95 < this->kernel_h);
    }
    uVar105 = (int)local_b40 + 1;
    uVar98 = (ulong)uVar105;
    iVar96 = (int)local_b68 + 1;
    if (this->use_int8_inference == false) {
      Mat::create(top_blob,uVar105,iVar96,this->num_output,(size_t)piVar67,opt->blob_allocator);
      iVar88 = -100;
      if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
      goto LAB_00128157;
      iVar96 = this->num_output;
      if (0 < (long)iVar96) {
        pvVar92 = top_blob->data;
        sVar68 = top_blob->cstep;
        sVar70 = top_blob->elemsize;
        local_a28 = (long)(int)uVar105;
        local_a1c = uVar101 * uVar65;
        local_a30 = 0;
        local_be8 = 0;
        do {
          if (-1 < (int)local_b68) {
            lVar91 = (long)(int)local_a30;
            local_be0 = (void *)(sVar68 * sVar70 * local_be8 + (long)pvVar92);
            iVar87 = this->bias_term;
            iVar88 = this->activation_type;
            pvVar106 = (this->weight_data).data;
            local_b60 = 0;
            do {
              if (-1 < (int)local_b40) {
                local_b70 = (float *)(this->activation_params).data;
                local_b48 = (this->bias_data).data;
                lVar99 = bottom_blob_int8.cstep *
                         CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                  (undefined4)bottom_blob_int8.elemsize);
                local_b50 = (void *)((long)(bottom_blob_int8.w * (int)local_b60 * this->stride_h) *
                                     CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                              (undefined4)bottom_blob_int8.elemsize) +
                                    (long)bottom_blob_int8.data);
                local_b58 = (long)this->stride_w;
                uVar104 = 0;
                do {
                  if (iVar87 == 0) {
                    fVar110 = 0.0;
                  }
                  else {
                    fVar110 = *(float *)((long)local_b48 + local_be8 * 4);
                  }
                  if (0 < (int)uVar65) {
                    uVar100 = 0;
                    pvVar94 = (void *)(lVar91 * 4 + (long)pvVar106);
                    do {
                      if (0 < (int)uVar101) {
                        uVar102 = 0;
                        do {
                          fVar110 = fVar110 + *(float *)((long)pvVar94 + uVar102 * 4) *
                                              *(float *)((long)local_b50 +
                                                        (long)piVar86[uVar102] * 4 +
                                                        lVar99 * uVar100 + uVar104 * local_b58 * 4);
                          uVar102 = uVar102 + 1;
                        } while (uVar101 != uVar102);
                      }
                      uVar100 = uVar100 + 1;
                      pvVar94 = (void *)((long)pvVar94 + __n * 4);
                    } while (uVar100 != uVar97);
                  }
                  switch(iVar88) {
                  case 1:
                    if (fVar110 <= 0.0) {
                      fVar110 = 0.0;
                    }
                    break;
                  case 2:
                    fVar110 = fVar110 * (float)(~-(uint)(0.0 < fVar110) & (uint)*local_b70 |
                                               -(uint)(0.0 < fVar110) & 0x3f800000);
                    break;
                  case 3:
                    if (fVar110 <= *local_b70) {
                      fVar110 = *local_b70;
                    }
                    if (local_b70[1] < fVar110) {
                      fVar110 = local_b70[1];
                    }
                    break;
                  case 4:
                    fVar110 = expf(-fVar110);
                    fVar110 = 1.0 / (fVar110 + 1.0);
                  }
                  *(float *)((long)local_be0 + uVar104 * 4) = fVar110;
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar98);
              }
              local_be0 = (void *)((long)local_be0 + local_a28 * 4);
              iVar103 = (int)local_b60;
              local_b60 = (ulong)(iVar103 + 1);
            } while (iVar103 != (int)local_b68);
          }
          local_be8 = local_be8 + 1;
          local_a30 = (ulong)(uint)((int)local_a30 + local_a1c);
        } while (local_be8 != iVar96);
      }
LAB_00128154:
      iVar88 = 0;
    }
    else if (this->use_int8_requantize == true) {
      auStack_b90._12_4_ = this->num_output;
      local_b98 = opt->workspace_allocator;
      auVar84._4_4_ = -(uint)(iVar96 == 0);
      auVar84._0_4_ = -(uint)(uVar105 == 0);
      auVar84._8_4_ = -(uint)(auStack_b90._12_4_ == 0);
      auVar84._12_4_ = 0;
      movmskps((int)auStack_b90,auVar84 << 0x20);
      ptr = (void *)0x0;
      uStack_bb0._0_4_ = 0;
      uStack_bb0._4_4_ = 0;
      uStack_bb0 = (Mat *)0x0;
      uStack_ba8 = 4;
      uStack_ba4 = 0;
      local_ba0._0_1_ = true;
      local_ba0._1_1_ = false;
      local_ba0._2_1_ = false;
      local_ba0._3_1_ = false;
      auStack_b90._4_4_ = uVar105;
      auStack_b90._0_4_ = 3;
      auStack_b90._8_4_ = iVar96;
      uStack_b80 = (long)(int)(iVar96 * uVar105) + 3U & 0x3ffffffffffffffc;
      lVar91 = uStack_b80 * (long)(int)auStack_b90._12_4_;
      if (lVar91 != 0) {
        __size = lVar91 * 4 + 4;
        if (local_b98 == (Allocator *)0x0) {
          ptr_1._0_4_ = 0;
          ptr_1._4_4_ = 0;
          iVar87 = posix_memalign(&ptr_1,0x10,__size);
          if (iVar87 != 0) {
            ptr_1._0_4_ = 0;
            ptr_1._4_4_ = 0;
          }
          ptr = (void *)CONCAT44(ptr_1._4_4_,ptr_1._0_4_);
        }
        else {
          iVar87 = (*local_b98->_vptr_Allocator[2])(local_b98,__size);
          ptr = (void *)CONCAT44(extraout_var_00,iVar87);
        }
        uStack_bb0 = (Mat *)((long)ptr + lVar91 * 4);
        *(undefined4 *)((long)ptr + lVar91 * 4) = 1;
      }
      if ((ptr == (void *)0x0) || ((long)(int)auStack_b90._12_4_ * uStack_b80 == 0)) {
LAB_001280ee:
        iVar88 = -100;
        bVar108 = false;
      }
      else {
        Mat::create(top_blob,uVar105,iVar96,this->num_output,1,opt->blob_allocator);
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_001280ee;
        if (0 < this->num_output) {
          local_a28 = CONCAT44(local_a28._4_4_,iVar88);
          local_b60 = CONCAT44(local_b60._4_4_,uVar101 * uVar65);
          local_b58 = (long)(int)uVar105;
          pfVar107 = (float *)0x0;
          do {
            if (-1 < (int)local_b68) {
              pvVar92 = (void *)(uStack_b80 * (long)pfVar107 * CONCAT44(uStack_ba4,uStack_ba8) +
                                (long)ptr);
              local_b50 = (void *)((long)((int)local_b60 * (int)pfVar107) +
                                  (long)(this->weight_data).data);
              iVar87 = 0;
              do {
                if (-1 < (int)local_b40) {
                  local_b48 = (void *)CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                               (undefined4)bottom_blob_int8.elemsize);
                  uVar104 = 0;
                  do {
                    if ((int)uVar65 < 1) {
                      iVar88 = 0;
                    }
                    else {
                      uVar100 = 0;
                      iVar88 = 0;
                      pvVar106 = local_b50;
                      do {
                        if (0 < (int)uVar101) {
                          uVar102 = 0;
                          do {
                            iVar88 = iVar88 + (int)*(char *)((long)pvVar106 + uVar102) *
                                              (int)*(char *)((long)bottom_blob_int8.data +
                                                            (long)piVar86[uVar102] +
                                                            bottom_blob_int8.cstep * (long)local_b48
                                                            * uVar100 +
                                                            (long)(bottom_blob_int8.w * iVar87 *
                                                                  this->stride_h) * (long)local_b48
                                                            + (long)(int)uVar104 *
                                                              (long)this->stride_w);
                            uVar102 = uVar102 + 1;
                          } while (uVar101 != uVar102);
                        }
                        pvVar106 = (void *)((long)pvVar106 + __n);
                        uVar100 = uVar100 + 1;
                      } while (uVar100 != uVar97);
                    }
                    *(int *)((long)pvVar92 + uVar104 * 4) = iVar88;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar98);
                }
                pvVar92 = (void *)((long)pvVar92 + local_b58 * 4);
                bVar108 = iVar87 != (int)local_b68;
                iVar87 = iVar87 + 1;
              } while (bVar108);
            }
            top_blob_g.allocator = top_blob->allocator;
            pAStack_a08 = (Allocator *)CONCAT44(uStack_ba4,uStack_ba8);
            ptr_1 = (void *)(uStack_b80 * (long)pfVar107 * (long)pAStack_a08 + (long)ptr);
            uStack_a10 = 0;
            uStack_a0c = 0;
            local_a00._0_1_ = (bool)(undefined1)local_ba0;
            local_a00._1_1_ = (bool)local_ba0._1_1_;
            local_a00._2_1_ = (bool)local_ba0._2_1_;
            local_a00._3_1_ = (bool)local_ba0._3_1_;
            local_9f8 = local_b98;
            local_9f0._4_4_ = auStack_b90._4_4_;
            local_9f0._0_4_ = 3;
            local_9f0._8_4_ = auStack_b90._8_4_;
            local_9f0._12_4_ = 1;
            local_9e0 = ((long)(int)(auStack_b90._8_4_ * auStack_b90._4_4_) * (long)pAStack_a08 +
                         0xfU & 0xfffffffffffffff0) / (ulong)pAStack_a08;
            top_blob_g.elemsize = top_blob->elemsize;
            top_blob_g.data =
                 (void *)(top_blob->cstep * (long)pfVar107 * top_blob_g.elemsize +
                         (long)top_blob->data);
            top_blob_g.elempack = top_blob->elempack;
            top_blob_g.refcount._0_4_ = 0;
            top_blob_g.refcount._4_4_ = 0;
            top_blob_g.w = top_blob->w;
            top_blob_g.dims = 3;
            top_blob_g.h = top_blob->h;
            top_blob_g.c = 1;
            top_blob_g.cstep =
                 ((long)(top_blob->h * top_blob->w) * top_blob_g.elemsize + 0xf & 0xfffffffffffffff0
                 ) / top_blob_g.elemsize;
            pLVar90 = (this->requantize_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pfVar107];
            local_b70 = pfVar107;
            (*pLVar90->_vptr_Layer[7])(pLVar90,&ptr_1,&top_blob_g);
            piVar67 = (int *)CONCAT44(top_blob_g.refcount._4_4_,top_blob_g.refcount._0_4_);
            if (piVar67 != (int *)0x0) {
              LOCK();
              *piVar67 = *piVar67 + -1;
              UNLOCK();
              if (*piVar67 == 0) {
                if (top_blob_g.allocator == (Allocator *)0x0) {
                  if (top_blob_g.data != (void *)0x0) {
                    free(top_blob_g.data);
                  }
                }
                else {
                  (*(top_blob_g.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            top_blob_g.elemsize = 0;
            top_blob_g.elempack = 0;
            top_blob_g.data = (void *)0x0;
            top_blob_g.refcount._0_4_ = 0;
            top_blob_g.refcount._4_4_ = 0;
            top_blob_g.dims = 0;
            top_blob_g.w = 0;
            top_blob_g.h = 0;
            top_blob_g.c = 0;
            top_blob_g.cstep = 0;
            piVar67 = (int *)CONCAT44(uStack_a0c,uStack_a10);
            if (piVar67 != (int *)0x0) {
              LOCK();
              *piVar67 = *piVar67 + -1;
              UNLOCK();
              if (*piVar67 == 0) {
                if (local_9f8 == (Allocator *)0x0) {
                  if (ptr_1 != (void *)0x0) {
                    free(ptr_1);
                  }
                }
                else {
                  (*local_9f8->_vptr_Allocator[3])();
                }
              }
            }
            pAStack_a08 = (Allocator *)0x0;
            local_a00 = 0;
            ptr_1._0_4_ = 0;
            ptr_1._4_4_ = 0;
            uStack_a10 = 0;
            uStack_a0c = 0;
            local_9f0 = (undefined1  [16])0x0;
            local_9e0 = 0;
            if ((this->activation_type == 1) && (0 < (int)(iVar96 * uVar105))) {
              lVar91 = top_blob->elemsize * top_blob->cstep * (long)pfVar107;
              pvVar92 = top_blob->data;
              uVar104 = 0;
              do {
                if (*(char *)((long)pvVar92 + uVar104 + lVar91) < '\0') {
                  *(undefined1 *)((long)pvVar92 + uVar104 + lVar91) = 0;
                }
                uVar104 = uVar104 + 1;
              } while (iVar96 * uVar105 != uVar104);
            }
            pfVar107 = (float *)((long)pfVar107 + 1);
          } while ((long)pfVar107 < (long)this->num_output);
          iVar88 = (int)local_a28;
        }
        bVar108 = true;
      }
      if (uStack_bb0 != (Mat *)0x0) {
        LOCK();
        *(int *)&uStack_bb0->data = *(int *)&uStack_bb0->data + -1;
        UNLOCK();
        if (*(int *)&uStack_bb0->data == 0) {
          if (local_b98 == (Allocator *)0x0) {
            if (ptr != (void *)0x0) {
              free(ptr);
            }
          }
          else {
            (*local_b98->_vptr_Allocator[3])();
          }
        }
      }
      uStack_ba8 = 0;
      uStack_ba4 = 0;
      local_ba0._0_1_ = false;
      local_ba0._1_1_ = false;
      local_ba0._2_1_ = false;
      local_ba0._3_1_ = false;
      ptr = (void *)0x0;
      uStack_bb0._0_4_ = 0;
      uStack_bb0._4_4_ = 0;
      auStack_b90 = (undefined1  [16])0x0;
      uStack_b80 = 0;
      if (bVar108) goto LAB_00128154;
    }
    else {
      Mat::create(top_blob,uVar105,iVar96,this->num_output,4,opt->blob_allocator);
      iVar88 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (0 < this->num_output) {
          local_b60 = CONCAT44(local_b60._4_4_,uVar101 * uVar65);
          local_b58 = (long)(int)uVar105;
          pfVar107 = (float *)0x0;
          do {
            if (-1 < (int)local_b68) {
              pvVar92 = (void *)(top_blob->cstep * (long)pfVar107 * top_blob->elemsize +
                                (long)top_blob->data);
              local_b50 = (void *)((long)((int)local_b60 * (int)pfVar107) +
                                  (long)(this->weight_data).data);
              iVar87 = 0;
              do {
                if (-1 < (int)local_b40) {
                  local_b48 = (void *)CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                               (undefined4)bottom_blob_int8.elemsize);
                  uVar104 = 0;
                  do {
                    if ((int)uVar65 < 1) {
                      iVar88 = 0;
                    }
                    else {
                      uVar100 = 0;
                      iVar88 = 0;
                      pvVar106 = local_b50;
                      do {
                        if (0 < (int)uVar101) {
                          uVar102 = 0;
                          do {
                            iVar88 = iVar88 + (int)*(char *)((long)pvVar106 + uVar102) *
                                              (int)*(char *)((long)bottom_blob_int8.data +
                                                            (long)piVar86[uVar102] +
                                                            bottom_blob_int8.cstep * (long)local_b48
                                                            * uVar100 +
                                                            (long)(bottom_blob_int8.w * iVar87 *
                                                                  this->stride_h) * (long)local_b48
                                                            + (long)(int)uVar104 *
                                                              (long)this->stride_w);
                            uVar102 = uVar102 + 1;
                          } while (uVar101 != uVar102);
                        }
                        pvVar106 = (void *)((long)pvVar106 + __n);
                        uVar100 = uVar100 + 1;
                      } while (uVar100 != uVar97);
                    }
                    *(int *)((long)pvVar92 + uVar104 * 4) = iVar88;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar98);
                }
                pvVar92 = (void *)((long)pvVar92 + local_b58 * 4);
                bVar108 = iVar87 != (int)local_b68;
                iVar87 = iVar87 + 1;
              } while (bVar108);
            }
            uVar76._0_1_ = opt->lightmode;
            uVar76._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar76._4_4_ = opt->num_threads;
            pAStack_a08 = opt->workspace_allocator;
            uVar77._0_1_ = opt->use_winograd_convolution;
            uVar77._1_1_ = opt->use_sgemm_convolution;
            uVar77._2_1_ = opt->use_int8_inference;
            uVar77._3_1_ = opt->use_vulkan_compute;
            uVar78 = opt->use_fp16_packed;
            uVar79 = opt->use_fp16_storage;
            uVar81 = opt->use_fp16_arithmetic;
            uVar83 = opt->use_int8_storage;
            uVar82 = CONCAT11(uVar83,uVar81);
            uVar80 = CONCAT21(uVar82,uVar79);
            uVar77._4_4_ = CONCAT31(uVar80,uVar78);
            ptr_1._0_4_ = (undefined4)uVar76;
            local_9f8 = *(Allocator **)&opt->use_int8_arithmetic;
            local_a00 = (undefined4)uVar77;
            ptr_1._4_4_ = 1;
            local_b98 = top_blob->allocator;
            uStack_a10 = SUB84(local_b98,0);
            uStack_a0c = (undefined4)((ulong)local_b98 >> 0x20);
            uStack_b80 = top_blob->elemsize;
            ptr = (void *)(top_blob->cstep * (long)pfVar107 * uStack_b80 + (long)top_blob->data);
            local_ba0 = top_blob->elempack;
            uStack_bb0._0_4_ = 0;
            uStack_bb0._4_4_ = 0;
            uStack_ba8 = (undefined4)uStack_b80;
            uStack_ba4 = (undefined4)(uStack_b80 >> 0x20);
            auStack_b90._4_4_ = top_blob->w;
            auStack_b90._0_4_ = 3;
            auStack_b90._8_4_ = top_blob->h;
            auStack_b90._12_4_ = 1;
            uStack_b80 = ((long)(top_blob->h * top_blob->w) * uStack_b80 + 0xf & 0xfffffffffffffff0)
                         / uStack_b80;
            pLVar90 = (this->dequantize_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pfVar107];
            local_b70 = pfVar107;
            uStack_9fc = uVar77._4_4_;
            (*pLVar90->_vptr_Layer[9])(pLVar90,&ptr,&ptr_1);
            piVar67 = (int *)CONCAT44(uStack_bb0._4_4_,(undefined4)uStack_bb0);
            if (piVar67 != (int *)0x0) {
              LOCK();
              *piVar67 = *piVar67 + -1;
              UNLOCK();
              if (*piVar67 == 0) {
                if (local_b98 == (Allocator *)0x0) {
                  if (ptr != (void *)0x0) {
                    free(ptr);
                  }
                }
                else {
                  (*local_b98->_vptr_Allocator[3])();
                }
              }
            }
            uStack_ba8 = 0;
            uStack_ba4 = 0;
            local_ba0._0_1_ = false;
            local_ba0._1_1_ = false;
            local_ba0._2_1_ = false;
            local_ba0._3_1_ = false;
            ptr = (void *)0x0;
            uStack_bb0._0_4_ = 0;
            uStack_bb0._4_4_ = 0;
            auStack_b90 = ZEXT816(0);
            uStack_b80 = 0;
            if ((this->activation_type == 1) && (0 < (int)(iVar96 * uVar105))) {
              lVar91 = top_blob->elemsize * top_blob->cstep * (long)pfVar107;
              pvVar92 = top_blob->data;
              uVar104 = 0;
              do {
                fVar110 = *(float *)((long)pvVar92 + uVar104 * 4 + lVar91);
                if (fVar110 <= 0.0) {
                  fVar110 = 0.0;
                }
                *(float *)((long)pvVar92 + uVar104 * 4 + lVar91) = fVar110;
                uVar104 = uVar104 + 1;
              } while (iVar96 * uVar105 != uVar104);
            }
            pfVar107 = (float *)((long)pfVar107 + 1);
          } while ((long)pfVar107 < (long)this->num_output);
        }
        goto LAB_00128154;
      }
    }
LAB_00128157:
    iVar103 = iVar88;
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (bottom_blob_int8.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_int8.refcount = *bottom_blob_int8.refcount + -1;
    UNLOCK();
    if (*bottom_blob_int8.refcount == 0) {
      if (bottom_blob_int8.allocator == (Allocator *)0x0) {
        if (bottom_blob_int8.data != (void *)0x0) {
          free(bottom_blob_int8.data);
        }
      }
      else {
        (*(bottom_blob_int8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001281e8:
  bottom_blob_int8.c = 0;
  bottom_blob_int8.h = 0;
  bottom_blob_int8.w = 0;
  bottom_blob_int8.dims = 0;
  bottom_blob_int8.elempack = 0;
  bottom_blob_int8.elemsize._4_4_ = 0;
  bottom_blob_int8.elemsize._0_4_ = 0;
  bottom_blob_int8.refcount._4_4_ = 0;
  bottom_blob_int8.refcount._0_4_ = 0;
  bottom_blob_int8.data = (void *)0x0;
  bottom_blob_int8.cstep = 0;
  if ((int *)pd.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)pd.params[0].v.data = *pd.params[0].v.data + -1;
    UNLOCK();
    if (*pd.params[0].v.data == 0) {
      if (pd.params[0].v._24_8_ == 0) {
        if (pd.params[0]._0_8_ != 0) {
          free((void *)pd.params[0]._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)pd.params[0].v._24_8_ + 0x18))();
      }
    }
  }
  return iVar103;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob_tm.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // requantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }       

                // activation relu
                if (activation_type == 1)
                {
                    signed char* outptr_s8 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        if (outptr_s8[i] < 0)
                            outptr_s8[i] = 0;
                    }
                }                                 
            }
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
      
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }

                // activation relu
                if (activation_type == 1)
                {
                    float* outptr_fp32 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        outptr_fp32[i] = std::max(outptr_fp32[i], 0.f);
                    }
                }
            }   
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = 1.f / (1.f + exp(-sum));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}